

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLMaterialRenderer.h
# Opt level: O3

void __thiscall
irr::video::COpenGLMaterialRenderer_SOLID::OnSetMaterial
          (COpenGLMaterialRenderer_SOLID *this,SMaterial *material,SMaterial *lastMaterial,
          bool resetAllRenderstates,IMaterialRendererServices *services)

{
  COpenGLDriver *this_00;
  long *plVar1;
  undefined7 in_register_00000009;
  
  this_00 = *(COpenGLDriver **)&(this->super_IMaterialRenderer).field_0x8;
  this_00->FixedPipelineState = (uint)(this_00->FixedPipelineState == EOFPS_DISABLE) * 3;
  COpenGLDriver::disableTextures(this_00,1);
  plVar1 = *(long **)&(this->super_IMaterialRenderer).field_0x8;
  (**(code **)(*plVar1 + 0x3c0))
            (plVar1,material,lastMaterial,
             CONCAT71(in_register_00000009,resetAllRenderstates) & 0xffffffff);
  return;
}

Assistant:

virtual void OnSetMaterial(const SMaterial &material, const SMaterial &lastMaterial,
			bool resetAllRenderstates, IMaterialRendererServices *services) override
	{
		if (Driver->getFixedPipelineState() == COpenGLDriver::EOFPS_DISABLE)
			Driver->setFixedPipelineState(COpenGLDriver::EOFPS_DISABLE_TO_ENABLE);
		else
			Driver->setFixedPipelineState(COpenGLDriver::EOFPS_ENABLE);

		Driver->disableTextures(1);
		Driver->setBasicRenderStates(material, lastMaterial, resetAllRenderstates);
	}